

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int writesettings(char *name)

{
  size_t sVar1;
  ssize_t sVar2;
  undefined8 uVar3;
  char *in_RDI;
  char buf [13];
  int j;
  int i;
  char fname [41];
  int fd;
  char local_5d [13];
  int local_50;
  int local_4c;
  char local_48 [52];
  int local_14;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  memset(local_5d,0,0xd);
  if (canfd_mode == 0) {
    strcpy(local_48,"sniffset.");
  }
  else {
    if (canfd_mode != 1) {
      printf("writesettings failed due to unspecified CAN FD mode\n");
      return 1;
    }
    strcpy(local_48,"sniffset_fd.");
  }
  sVar1 = strlen(local_48);
  strncat(local_48,local_10,0x28 - sVar1);
  local_14 = open(local_48,0x41,0x1a4);
  if (local_14 < 1) {
    printf("unable to write setting file \'%s\'!\n",local_48);
    local_4 = 1;
  }
  else {
    for (local_4c = 0; local_4c < idx; local_4c = local_4c + 1) {
      uVar3 = 0x30;
      if ((sniftab[local_4c].flags & 1U) != 0) {
        uVar3 = 0x31;
      }
      sprintf(local_5d,"<%08X>%c.",(ulong)sniftab[local_4c].current.can_id,uVar3);
      sVar2 = write(local_14,local_5d,0xc);
      if (sVar2 < 0) {
        perror("write");
        return 1;
      }
      for (local_50 = 0; local_50 < max_dlen; local_50 = local_50 + 1) {
        sprintf(local_5d,"%02X",(ulong)*(byte *)((long)local_4c * 0x158 + 0x107298 + (long)local_50)
               );
        sVar2 = write(local_14,local_5d,2);
        if (sVar2 < 0) {
          perror("write");
          return 1;
        }
      }
      sVar2 = write(local_14,"\n",1);
      if (sVar2 < 0) {
        perror("write");
        return 1;
      }
    }
    close(local_14);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int writesettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	int i,j;
	char buf[13]= {0};

	if (canfd_mode == CANFD_OFF)
		strcpy(fname, SETFNAME);
	else if (canfd_mode == CANFD_ON)
		strcpy(fname, SETFDFNAME);
	else {
		printf("writesettings failed due to unspecified CAN FD mode\n");
		return 1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_WRONLY|O_CREAT, S_IRUSR|S_IWUSR|S_IRGRP|S_IROTH);
	if (fd <= 0) {
		printf("unable to write setting file '%s'!\n", fname);
		return 1;
	}

	for (i = 0; i < idx ;i++) {
		sprintf(buf, "<%08X>%c.", sniftab[i].current.can_id, (is_set(i, ENABLE))?'1':'0');
		if (write(fd, buf, 12) < 0) {
			perror("write");
			return 1;
		}
		for (j = 0; j < max_dlen ; j++) {
			sprintf(buf, "%02X", sniftab[i].notch.data[j]);
			if (write(fd, buf, 2) < 0) {
				perror("write");
				return 1;
			}
		}
		if (write(fd, "\n", 1) < 0) {
			perror("write");
			return 1;
		}
		/* Classical CAN: 12 + 16  + 1 = 29  bytes per entry */
		/* CAN FD:        12 + 128 + 1 = 141 bytes per entry */
	}
	close(fd);
	return 0;
}